

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

string * __thiscall
flatbuffers::swift::SwiftGenerator::SwiftConstant_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  psVar1 = &(field->value).constant;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = ".nan";
    pcVar4 = "";
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) ||
       ((iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0 ||
        (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = ".infinity";
      pcVar4 = "";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "-.infinity";
        pcVar4 = "";
      }
      else {
        if ((field->value).type.base_type != BASE_TYPE_BOOL) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar2 = (field->value).constant._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar2,
                     pcVar2 + (field->value).constant._M_string_length);
          return __return_storage_ptr__;
        }
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        pcVar5 = "true";
        if (iVar3 == 0) {
          pcVar5 = "false";
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = pcVar5 + (ulong)(iVar3 == 0) + 4;
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string SwiftConstant(const FieldDef &field) {
    const auto default_value =
        StringIsFlatbufferNan(field.value.constant)                ? ".nan"
        : StringIsFlatbufferPositiveInfinity(field.value.constant) ? ".infinity"
        : StringIsFlatbufferNegativeInfinity(field.value.constant)
            ? "-.infinity"
        : IsBool(field.value.type.base_type)
            ? ("0" == field.value.constant ? "false" : "true")
            : field.value.constant;
    return default_value;
  }